

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * __thiscall
libtorrent::convert_from_native_path_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,char *s)

{
  allocator<char> local_31;
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,(char *)this,&local_31);
  convert_from_native(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string convert_from_native_path(char const* s) { return convert_from_native(s); }